

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hold_ptr.h
# Opt level: O1

void __thiscall
booster::hold_ptr<booster::log::sinks::syslog::data>::~hold_ptr
          (hold_ptr<booster::log::sinks::syslog::data> *this)

{
  data *pdVar1;
  pointer pcVar2;
  
  pdVar1 = this->ptr_;
  if (pdVar1 != (data *)0x0) {
    pcVar2 = (pdVar1->id)._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar2 != &(pdVar1->id).field_2) {
      operator_delete(pcVar2);
    }
    operator_delete(pdVar1);
    return;
  }
  return;
}

Assistant:

~hold_ptr() 
		{
			if(ptr_) delete ptr_;
		}